

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int kwssys::SystemTools::Strucmp(char *l,char *r)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  int rc;
  int lc;
  bool local_19;
  char *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    iVar1 = tolower((int)*local_8);
    iVar2 = tolower((int)*local_10);
    local_19 = iVar1 == iVar2 && iVar1 != 0;
    local_10 = local_10 + 1;
    local_8 = local_8 + 1;
  } while (local_19);
  return iVar1 - iVar2;
}

Assistant:

int SystemTools::Strucmp(const char* l, const char* r)
{
  int lc;
  int rc;
  do {
    lc = tolower(*l++);
    rc = tolower(*r++);
  } while (lc == rc && lc);
  return lc - rc;
}